

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Labels.cpp
# Opt level: O1

void __thiscall Labels::displayArrays(Labels *this)

{
  ostream *poVar1;
  ulong uVar2;
  size_type *psVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," Current size ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (current_size != 0) {
    psVar3 = &labels_string_abi_cxx11_[0]._M_string_length;
    uVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"String : ",9);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(((string *)(psVar3 + -1))->_M_dataplus)._M_p,
                          *psVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Counter : ",10);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Activated: ",0xb);
      poVar1 = std::ostream::_M_insert<bool>(true);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      uVar2 = uVar2 + 1;
      psVar3 = psVar3 + 4;
    } while (uVar2 < current_size);
  }
  return;
}

Assistant:

void Labels::displayArrays(){
    cerr << " Current size " << current_size << endl;
    for(unsigned int i=0;i<current_size;i++){
        cerr << "String : " << labels_string[i]   << endl;
        cerr << "Counter : " << labels_counter[i]  << endl;
        cerr << "Activated: " << labels_activated[i]<< endl;
    }
}